

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteorder.c
# Opt level: O0

Token * has_tok_dollar(List *ls,TokenType type,int number)

{
  Token *t;
  int number_local;
  TokenType type_local;
  List *ls_local;
  
  if (ls == (List *)0x0) {
    ls_local = (List *)0x0;
  }
  else if (((ls->token).type == type) && ((uint)(ls->token).u.reginfo.which == number)) {
    ls_local = (List *)&ls->token;
  }
  else {
    ls_local = (List *)has_tok_dollar(ls->car,type,number);
    if (ls_local == (List *)0x0) {
      ls_local = (List *)has_tok_dollar(ls->cdr,type,number);
    }
  }
  return (Token *)ls_local;
}

Assistant:

static Token *
has_tok_dollar (List *ls, TokenType type, int number)
{
  Token *t;

  if (ls == NULL)
    return NULL;
  if (ls->token.type == type
      && ls->token.u.dollarinfo.which == number)
    return &ls->token;
  t = has_tok_dollar (ls->car, type, number);
  if (t != NULL)
    return t;
  return has_tok_dollar (ls->cdr, type, number);
}